

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void ossaddsb(osgen_txtwin_t *win,char *p,size_t len,int draw)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  char **ppcVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int y;
  int local_40;
  
  if (win->txtbuf != (char *)0x0) {
    local_40 = (win->base).x - (win->base).scrollx;
    y = (win->base).y - (win->base).scrolly;
    if (len == 0) {
      iVar9 = 0;
    }
    else {
      iVar9 = 0;
      do {
        bVar1 = *p;
        if (bVar1 < 10) {
          if (bVar1 == 1) {
            bVar1 = ((byte *)p)[1];
            (win->base).txtattr = (uint)bVar1;
            if ((win->base).x == 0) {
              win->solattr = (uint)bVar1;
            }
            pcVar6 = win->txtfree;
            lVar8 = 0;
            do {
              iVar3 = osssb_add_byte(win,((byte *)p)[lVar8]);
              if (iVar3 == 0) {
                win->txtfree = pcVar6;
                break;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != 2);
            p = (char *)((byte *)p + 2);
            len = len - 2;
          }
          else if (bVar1 == 2) {
            bVar1 = ((byte *)p)[1];
            (win->base).txtfg = bVar1;
            bVar2 = ((byte *)p)[2];
            (win->base).txtbg = bVar2;
            if ((win->base).x == 0) {
              win->solfg = (int)(char)bVar1;
              win->solbg = (int)(char)bVar2;
            }
            pcVar6 = win->txtfree;
            lVar8 = -3;
            do {
              iVar3 = osssb_add_byte(win,((byte *)p)[lVar8 + 3]);
              if (iVar3 == 0) {
                win->txtfree = pcVar6;
                break;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0);
            p = (char *)((byte *)p + 3);
            len = len - 3;
          }
          else {
LAB_001e98e1:
            iVar3 = osssb_add_byte(win,bVar1);
            if (iVar3 != 0) {
              iVar3 = (win->base).x;
              if ((win->base).xmax < iVar3) {
                (win->base).xmax = iVar3;
              }
              (win->base).x = iVar3 + 1;
              iVar9 = iVar9 + 1;
            }
            p = (char *)((byte *)p + 1);
            len = len - 1;
          }
        }
        else if (bVar1 == 10) {
          osssb_new_line(win);
          if (draw != 0) {
            osgen_scrdisp(&win->base,local_40,y,iVar9);
          }
          p = (char *)((byte *)p + 1);
          local_40 = (win->base).x - (win->base).scrollx;
          len = len - 1;
          y = y + 1;
          iVar9 = 0;
          if (draw != 0) {
            osgen_auto_vscroll(win);
            iVar9 = 0;
          }
        }
        else {
          if (bVar1 != 0xd) goto LAB_001e98e1;
          uVar4 = (ulong)(win->base).y;
          if (((long)uVar4 < 0) || (win->line_count <= uVar4)) {
            ppcVar5 = (char **)0x0;
          }
          else {
            uVar4 = uVar4 + win->first_line;
            uVar7 = 0;
            if (win->line_ptr_cnt <= uVar4) {
              uVar7 = win->line_ptr_cnt;
            }
            ppcVar5 = win->line_ptr + (uVar4 - uVar7);
          }
          if (ppcVar5 == (char **)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = *ppcVar5;
          }
          win->txtfree = pcVar6;
          iVar9 = win->solbg;
          (win->base).txtfg = (char)win->solfg;
          (win->base).txtbg = (char)iVar9;
          (win->base).txtattr = win->solattr;
          osssb_add_color_code(win);
          if ((-1 < y && draw != 0) && (y < (int)(win->base).ht)) {
            iVar3 = (win->base).winy + y;
            iVar9 = (win->base).winx;
            ossclr(iVar3,iVar9,iVar3,iVar9 + (int)(win->base).wid + -1,(win->base).oss_fillcolor);
          }
          (win->base).x = 0;
          p = (char *)((byte *)p + 1);
          len = len - 1;
          local_40 = 0;
          iVar9 = 0;
        }
      } while (len != 0);
    }
    iVar3 = osssb_add_byte(win,'\0');
    if (iVar3 != 0) {
      pcVar6 = win->txtfree;
      if (win->txtbuf == pcVar6) {
        pcVar6 = win->txtbuf + win->txtbufsiz;
      }
      win->txtfree = pcVar6 + -1;
    }
    if (draw != 0) {
      osgen_scrdisp(&win->base,local_40,y,iVar9);
      osgen_auto_vscroll(win);
      return;
    }
  }
  return;
}

Assistant:

static void ossaddsb(osgen_txtwin_t *win, const char *p, size_t len, int draw)
{
    int startx;
    int starty;
    int line_len;

    /* if there's no scrollback buffer, ignore it */
    if (win->txtbuf == 0)
        return;

    /* note the starting x,y position, for redrawing purposes */
    startx = win->base.x - win->base.scrollx;
    starty = win->base.y - win->base.scrolly;

    /* we haven't added any characters to the line yet */
    line_len = 0;

    /*
     *   Copy the text into the screen buffer, respecting the circular
     *   nature of the screen buffer.  If the given text wraps lines,
     *   enter an explicit carriage return into the text to ensure that
     *   users can correctly count lines.
     */
    while (len != 0)
    {
        /* check what we have */
        switch(*p)
        {
        case OSGEN_ATTR:
            /* switch to the new attributes */
            win->base.txtattr = (unsigned char)*(p+1);

            /* 
             *   if we're at the start of the line, this is the start-of-line
             *   attribute - this will ensure that if we back up with '\r',
             *   we'll re-apply this attribute change 
             */
            if (win->base.x == 0)
                win->solattr = win->base.txtattr;

            /* add the two-byte sequence */
            osssb_add_bytes(win, p, 2);
            p += 2;
            len -= 2;
            break;

        case OSGEN_COLOR:
            /* switch to the new colors */
            win->base.txtfg = (unsigned char)*(p+1);
            win->base.txtbg = (unsigned char)*(p+2);

            /* 
             *   if we're at the start of the line, this is the new
             *   start-of-line color 
             */
            if (win->base.x == 0)
            {
                win->solfg = win->base.txtfg;
                win->solbg = win->base.txtbg;
            }

            /* add and skip the three-byte color sequence */
            osssb_add_bytes(win, p, 3);
            p += 3;
            len -= 3;
            break;
            
        case '\n':
            /* add the new line */
            osssb_new_line(win);

            /* draw the part of the line we added */
            if (draw)
                osgen_scrdisp(&win->base, startx, starty, line_len);

            /* skip this character */
            ++p;
            --len;

            /* reset to the next line */
            startx = win->base.x - win->base.scrollx;
            ++starty;
            line_len = 0;

            /* bring the cursor onto the screen if auto-vscrolling */
            if (draw)
                osgen_auto_vscroll(win);

            /* done */
            break;

        case '\r':
            /*
             *   We have a plain carriage return, which indicates that we
             *   should go back to the start of the current line and
             *   overwrite it.  (This is most likely to occur for the
             *   "[More]" prompt.)
             */

            /* set the free pointer back to the start of the current line */
            win->txtfree = osgen_get_line(win, win->base.y);

            /* switch back to the color as of the start of the line */
            win->base.txtfg = win->solfg;
            win->base.txtbg = win->solbg;
            win->base.txtattr = win->solattr;

            /* 
             *   since we're back at the start of the line, add a color code
             *   if necessary 
             */
            osssb_add_color_code(win);

            /* clear the window area of the line we're overwriting */
            if (draw && starty >= 0 && starty < (int)win->base.ht)
                ossclr(win->base.winy + starty, win->base.winx,
                       win->base.winy + starty,
                       win->base.winx + win->base.wid - 1,
                       win->base.oss_fillcolor);

            /* reset to the start of the line */
            line_len = 0;
            startx = 0;

            /* move to the left column */
            win->base.x = 0;

            /* skip this character */
            ++p;
            --len;

            /* done */
            break;

        default:
            /* for anything else, simply store the byte in the buffer */
            if (osssb_add_byte(win, *p))
            {
                /* note the maximum output position if appropriate */
                if (win->base.x > win->base.xmax)
                    win->base.xmax = win->base.x;

                /* adjust the output x position */
                win->base.x++;

                /* count the ordinary character in the display length */
                ++line_len;
            }
            
            /* skip the character */
            ++p;
            --len;
                
            /* done */
            break;
        }
    }

    /* 
     *   Add a safety null terminator after each addition, in case we need
     *   to look at the buffer before this line is finished.  
     */
    osssb_add_safety_null(win);

    /* display the added text */
    if (draw)
    {
        /* show the added text */
        osgen_scrdisp(&win->base, startx, starty, line_len);

        /* bring the cursor onto the screen if auto-vscrolling */
        osgen_auto_vscroll(win);
    }
}